

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O2

bool __thiscall irr::CIrrDeviceSDL::run(CIrrDeviceSDL *this)

{
  ulong uVar1;
  long *plVar2;
  pointer pp_Var3;
  _SDL_Joystick *p_Var4;
  stringw *psVar5;
  bool bVar6;
  byte bVar7;
  char cVar8;
  undefined2 uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  EKEY_CODE key;
  ulong uVar14;
  double __x;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  undefined4 local_e0 [2];
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint local_c8;
  uint local_c4;
  SKeyMap mp;
  SDL_Event SDL_event;
  string<char> local_68;
  undefined2 local_38;
  undefined1 local_36;
  
  os::Timer::tick();
  do {
    if (((this->super_CIrrDeviceStub).Close != false) ||
       (iVar10 = SDL_PollEvent(&SDL_event), iVar10 == 0)) {
      SDL_JoystickUpdate();
      local_68.str._M_dataplus._M_p._0_4_ = 8;
      for (uVar12 = 0;
          pp_Var3 = (this->Joysticks).m_data.
                    super__Vector_base<_SDL_Joystick_*,_std::allocator<_SDL_Joystick_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
          uVar12 < ((ulong)((long)(this->Joysticks).m_data.
                                  super__Vector_base<_SDL_Joystick_*,_std::allocator<_SDL_Joystick_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var3) >> 3 &
                   0xffffffff); uVar12 = uVar12 + 1) {
        p_Var4 = pp_Var3[uVar12];
        if (p_Var4 != (_SDL_Joystick *)0x0) {
          iVar10 = SDL_JoystickNumButtons(p_Var4);
          if (0x1f < iVar10) {
            iVar10 = 0x20;
          }
          local_68.str._M_string_length._0_4_ = 0;
          iVar13 = 0;
          if (iVar10 < 1) {
            iVar10 = iVar13;
          }
          for (; iVar10 != iVar13; iVar13 = iVar13 + 1) {
            bVar7 = SDL_JoystickGetButton();
            local_68.str._M_string_length._0_4_ =
                 (uint)local_68.str._M_string_length | (uint)bVar7 << ((byte)iVar13 & 0x1f);
          }
          uVar11 = SDL_JoystickNumAxes(p_Var4);
          if (0x11 < (int)uVar11) {
            uVar11 = 0x12;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          local_68.str._12_8_ = 0;
          local_68.str.field_2._M_allocated_capacity._4_4_ = 0;
          for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
            uVar9 = SDL_JoystickGetAxis();
            *(undefined2 *)((long)&local_68.str._M_string_length + uVar14 * 2 + 4) = uVar9;
          }
          iVar10 = SDL_JoystickNumHats(p_Var4);
          uVar9 = 0xffff;
          if (0 < iVar10) {
            cVar8 = SDL_JoystickGetHat(p_Var4,0);
            if ((byte)(cVar8 - 1U) < 0xc) {
              uVar9 = *(undefined2 *)(&DAT_0024840a + (ulong)(byte)(cVar8 - 1U) * 2);
            }
          }
          local_36 = (undefined1)uVar12;
          local_38 = uVar9;
          (*(this->super_CIrrDeviceStub).super_IrrlichtDevice._vptr_IrrlichtDevice[0x19])(this);
        }
      }
      return (bool)((this->super_CIrrDeviceStub).Close ^ 1);
    }
    if (SDL_event.type - 0x300 < 2) {
      mp.SDLKey = SDL_event.window.data2;
      uVar11 = core::array<irr::CIrrDeviceSDL::SKeyMap>::binary_search(&this->KeyMap,&mp);
      if ((uVar11 == 0xffffffff) ||
         (key = (this->KeyMap).m_data.
                super__Vector_base<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar11].Win32Key, key == KEY_UNKNOWN)) {
        core::string<char>::string(&local_68,mp.SDLKey);
        key = KEY_UNKNOWN;
        os::Printer::log(__x);
        ::std::__cxx11::string::_M_dispose();
      }
      iVar10 = SDL_IsTextInputActive();
      if ((iVar10 == 0) ||
         (bVar6 = keyIsKnownSpecial(key), (SDL_event.key.keysym.mod & 0xc0) != 0 || bVar6)) {
        local_e0[0] = 2;
        uStack_d0._0_5_ =
             CONCAT14(((SDL_event.key.keysym.mod & 0xc0) != 0) << 2 |
                      ((SDL_event.key.keysym.mod & 3) != 0) * '\x02' |
                      uStack_d0._4_1_ & 0xf8 | SDL_event.type == 0x300,(undefined4)uStack_d0);
        local_d8._4_4_ = key;
        iVar10 = findCharToPassToIrrlicht(mp.SDLKey,key);
        local_d8 = (stringw *)CONCAT44(local_d8._4_4_,iVar10);
        goto LAB_0022139a;
      }
    }
    else if (SDL_event.type - 0x401 < 2) {
      uVar12 = SDL_GetModState();
      local_e0[0] = 1;
      local_d8 = (stringw *)
                 CONCAT26(SDL_event.motion.y._2_2_,
                          CONCAT24(SDL_event.key.keysym.mod,SDL_event.window.data2));
      uStack_d0._0_5_ =
           CONCAT14(((uVar12 & 0xc0) != 0) * '\x02' | (uVar12 & 3) != 0 | uStack_d0._4_1_ & 0xfc,
                    (undefined4)uStack_d0);
      local_c4 = 6;
      if ((SDL_event.key.keysym.scancode & (SDL_SCANCODE_LCTRL|SDL_SCANCODE_2)) == 3) {
        if (SDL_event.type == 0x401) {
          local_c4 = 1;
          local_c8 = this->MouseButtonStates | 2;
        }
        else {
          local_c4 = 4;
          local_c8 = this->MouseButtonStates & 0xfffffffd;
        }
      }
      else if ((SDL_event.key.keysym.scancode & (SDL_SCANCODE_LCTRL|SDL_SCANCODE_2)) == 2) {
        if (SDL_event.type == 0x401) {
          local_c4 = 2;
          local_c8 = this->MouseButtonStates | 4;
        }
        else {
          local_c4 = 5;
          local_c8 = this->MouseButtonStates & 0xfffffffb;
        }
      }
      else {
        if (SDL_event.edit.text[4] != '\x01') {
          local_c8 = this->MouseButtonStates;
          goto LAB_002213a9;
        }
        if (SDL_event.type == 0x401) {
          local_c4 = 0;
          local_c8 = this->MouseButtonStates | 1;
        }
        else {
          local_c4 = 3;
          local_c8 = this->MouseButtonStates & 0xfffffffe;
        }
      }
      this->MouseButtonStates = local_c8;
      (*(this->super_CIrrDeviceStub).super_IrrlichtDevice._vptr_IrrlichtDevice[0x19])(this);
      if (local_c4 < 3) {
        iVar10 = (*(this->super_CIrrDeviceStub).super_IrrlichtDevice._vptr_IrrlichtDevice[0x35])
                           (this,(ulong)local_d8 & 0xffffffff,(ulong)local_d8 >> 0x20);
        if (iVar10 == 3) {
          local_c4 = local_c4 + 0xb;
        }
        else {
          if (iVar10 != 2) goto LAB_002213a9;
          local_c4 = local_c4 + 8;
        }
        goto LAB_0022139a;
      }
    }
    else if (SDL_event.type == 0x100) {
      (this->super_CIrrDeviceStub).Close = true;
    }
    else {
      if (SDL_event.type == 0x200) {
        if ((SDL_event.display.event == '\x05') &&
           ((SDL_event.display.data1 != this->Width || (SDL_event.window.data2 != this->Height)))) {
          this->Width = SDL_event.display.data1;
          this->Height = SDL_event.window.data2;
          plVar2 = *(long **)&(this->super_CIrrDeviceStub).super_IrrlichtDevice.field_0x8;
          if (plVar2 != (long *)0x0) {
            local_68.str._M_dataplus._M_p._0_4_ = SDL_event.display.data1;
            local_68.str._M_dataplus._M_p._4_4_ = SDL_event.window.data2;
            (**(code **)(*plVar2 + 0x260))(plVar2,&local_68);
          }
        }
      }
      else {
        if (SDL_event.type == 0x303) {
          local_e0[0] = 3;
          local_d8 = (stringw *)operator_new(0x20);
          (local_d8->str)._M_dataplus._M_p = (pointer)&(local_d8->str).field_2;
          (local_d8->str)._M_string_length = 0;
          (local_d8->str).field_2._M_local_buf[0] = L'\0';
          core::utf8ToWString(local_d8,SDL_event.edit.text);
          (*(this->super_CIrrDeviceStub).super_IrrlichtDevice._vptr_IrrlichtDevice[0x19])
                    (this,local_e0);
          psVar5 = local_d8;
          if (local_d8 != (stringw *)0x0) {
            ::std::__cxx11::wstring::_M_dispose();
          }
          operator_delete(psVar5,0x20);
          local_d8 = (stringw *)0x0;
          goto LAB_002213a9;
        }
        if (SDL_event.type != 0x8000) {
          if (SDL_event.type == 0x403) {
            uVar12 = SDL_GetModState();
            local_e0[0] = 1;
            local_c4 = 7;
            uStack_d0._0_5_ =
                 CONCAT14(((uVar12 & 0xc0) != 0) * '\x02' | (uVar12 & 3) != 0 |
                          uStack_d0._4_1_ & 0xfc,SDL_event.motion.yrel);
            local_d8._0_4_ = this->MouseX;
            local_d8._4_4_ = this->MouseY;
          }
          else {
            dVar18 = (double)DAT_0023e050;
            dVar19 = DAT_0023e050._8_8_;
            if (SDL_event.type == 0x700) {
              local_c4 = 0;
              uVar12._0_4_ = this->Width;
              uVar12._4_4_ = this->Height;
              auVar15._0_8_ = uVar12 & 0xffffffff;
              auVar15._8_4_ = uVar12._4_4_;
              auVar15._12_4_ = 0;
              uStack_d0 = CONCAT44((int)((float)(SUB168(auVar15 | _DAT_0023e050,8) - dVar19) *
                                        SDL_event.wheel.preciseX),
                                   (int)((float)(SUB168(auVar15 | _DAT_0023e050,0) - dVar18) *
                                        (float)CONCAT22(SDL_event.motion.y._2_2_,
                                                        SDL_event.key.keysym.mod)));
              local_c8 = this->CurrentTouchCount + 1;
              this->CurrentTouchCount = local_c8;
LAB_002211b9:
              local_d8 = (stringw *)CONCAT44(SDL_event.window.data2,SDL_event.display.data1);
              local_e0[0] = 4;
            }
            else if (SDL_event.type == 0x701) {
              local_e0[0] = 4;
              local_c4 = 1;
              local_d8 = (stringw *)CONCAT44(SDL_event.window.data2,SDL_event.display.data1);
              uVar14._0_4_ = this->Width;
              uVar14._4_4_ = this->Height;
              auVar17._0_8_ = uVar14 & 0xffffffff;
              auVar17._8_4_ = uVar14._4_4_;
              auVar17._12_4_ = 0;
              uStack_d0 = CONCAT44((int)((float)(SUB168(auVar17 | _DAT_0023e050,8) - dVar19) *
                                        SDL_event.wheel.preciseX),
                                   (int)((float)(SUB168(auVar17 | _DAT_0023e050,0) - dVar18) *
                                        (float)CONCAT22(SDL_event.motion.y._2_2_,
                                                        SDL_event.key.keysym.mod)));
              local_c8 = this->CurrentTouchCount;
              if (0 < (int)local_c8) {
                this->CurrentTouchCount = local_c8 - 1;
              }
            }
            else {
              if (SDL_event.type == 0x702) {
                local_c4 = 2;
                uVar1._0_4_ = this->Width;
                uVar1._4_4_ = this->Height;
                auVar16._0_8_ = uVar1 & 0xffffffff;
                auVar16._8_4_ = uVar1._4_4_;
                auVar16._12_4_ = 0;
                uStack_d0 = CONCAT44((int)((float)(SUB168(auVar16 | _DAT_0023e050,8) - dVar19) *
                                          SDL_event.wheel.preciseX),
                                     (int)((float)(SUB168(auVar16 | _DAT_0023e050,0) - dVar18) *
                                          (float)CONCAT22(SDL_event.motion.y._2_2_,
                                                          SDL_event.key.keysym.mod)));
                local_c8 = this->CurrentTouchCount;
                goto LAB_002211b9;
              }
              if (SDL_event.type != 0x400) goto LAB_002213a9;
              uVar12 = SDL_GetModState();
              local_e0[0] = 1;
              local_c4 = 6;
              local_d8 = (stringw *)
                         CONCAT44(CONCAT22(SDL_event.motion.y._2_2_,SDL_event.key.keysym.mod),
                                  SDL_event.window.data2);
              this->MouseX = SDL_event.window.data2;
              this->MouseY = CONCAT22(SDL_event.motion.y._2_2_,SDL_event.key.keysym.mod);
              this->MouseXRel = SDL_event.key.keysym.unused;
              this->MouseYRel = SDL_event.motion.yrel;
              local_c8 = this->MouseButtonStates;
              uStack_d0._0_5_ =
                   CONCAT14(((uVar12 & 0xc0) != 0) * '\x02' | (uVar12 & 3) != 0 |
                            uStack_d0._4_1_ & 0xfc,(undefined4)uStack_d0);
            }
          }
          goto LAB_0022139a;
        }
      }
      local_e0[0] = 10;
      local_d8 = (stringw *)CONCAT44(SDL_event.window.data2,SDL_event.display.data1);
      uStack_d0 = CONCAT44(SDL_event.key.keysym.unused,
                           CONCAT22(SDL_event.motion.y._2_2_,SDL_event.key.keysym.mod));
LAB_0022139a:
      (*(this->super_CIrrDeviceStub).super_IrrlichtDevice._vptr_IrrlichtDevice[0x19])(this);
    }
LAB_002213a9:
    resetReceiveTextInputEvents(this);
  } while( true );
}

Assistant:

bool CIrrDeviceSDL::run()
{
	os::Timer::tick();

	SEvent irrevent;
	SDL_Event SDL_event;

	while (!Close && SDL_PollEvent(&SDL_event)) {
		// os::Printer::log("event: ", core::stringc((int)SDL_event.type).c_str(),   ELL_INFORMATION);	// just for debugging

		switch (SDL_event.type) {
		case SDL_MOUSEMOTION: {
			SDL_Keymod keymod = SDL_GetModState();

			irrevent.EventType = irr::EET_MOUSE_INPUT_EVENT;
			irrevent.MouseInput.Event = irr::EMIE_MOUSE_MOVED;
			MouseX = irrevent.MouseInput.X = SDL_event.motion.x;
			MouseY = irrevent.MouseInput.Y = SDL_event.motion.y;
			MouseXRel = SDL_event.motion.xrel;
			MouseYRel = SDL_event.motion.yrel;
			irrevent.MouseInput.ButtonStates = MouseButtonStates;
			irrevent.MouseInput.Shift = (keymod & KMOD_SHIFT) != 0;
			irrevent.MouseInput.Control = (keymod & KMOD_CTRL) != 0;

			postEventFromUser(irrevent);
			break;
		}
		case SDL_MOUSEWHEEL: {
			SDL_Keymod keymod = SDL_GetModState();

			irrevent.EventType = irr::EET_MOUSE_INPUT_EVENT;
			irrevent.MouseInput.Event = irr::EMIE_MOUSE_WHEEL;
#if SDL_VERSION_ATLEAST(2, 0, 18)
			irrevent.MouseInput.Wheel = SDL_event.wheel.preciseY;
#else
			irrevent.MouseInput.Wheel = SDL_event.wheel.y;
#endif
			irrevent.MouseInput.Shift = (keymod & KMOD_SHIFT) != 0;
			irrevent.MouseInput.Control = (keymod & KMOD_CTRL) != 0;
			irrevent.MouseInput.X = MouseX;
			irrevent.MouseInput.Y = MouseY;

			postEventFromUser(irrevent);
			break;
		}
		case SDL_MOUSEBUTTONDOWN:
		case SDL_MOUSEBUTTONUP: {
			SDL_Keymod keymod = SDL_GetModState();

			irrevent.EventType = irr::EET_MOUSE_INPUT_EVENT;
			irrevent.MouseInput.X = SDL_event.button.x;
			irrevent.MouseInput.Y = SDL_event.button.y;
			irrevent.MouseInput.Shift = (keymod & KMOD_SHIFT) != 0;
			irrevent.MouseInput.Control = (keymod & KMOD_CTRL) != 0;

			irrevent.MouseInput.Event = irr::EMIE_MOUSE_MOVED;

#ifdef _IRR_EMSCRIPTEN_PLATFORM_
			// Handle mouselocking in emscripten in Windowed mode.
			// In fullscreen SDL will handle it.
			// The behavior we want windowed is - when the canvas was clicked then
			// we will lock the mouse-pointer if it should be invisible.
			// For security reasons this will be delayed until the next mouse-up event.
			// We do not pass on this event as we don't want the activation click to do anything.
			if (SDL_event.type == SDL_MOUSEBUTTONDOWN && !isFullscreen()) {
				EmscriptenPointerlockChangeEvent pointerlockStatus; // let's hope that test is not expensive ...
				if (emscripten_get_pointerlock_status(&pointerlockStatus) == EMSCRIPTEN_RESULT_SUCCESS) {
					if (CursorControl->isVisible() && pointerlockStatus.isActive) {
						emscripten_exit_pointerlock();
						return !Close;
					} else if (!CursorControl->isVisible() && !pointerlockStatus.isActive) {
						emscripten_request_pointerlock(0, true);
						return !Close;
					}
				}
			}
#endif

			switch (SDL_event.button.button) {
			case SDL_BUTTON_LEFT:
				if (SDL_event.type == SDL_MOUSEBUTTONDOWN) {
					irrevent.MouseInput.Event = irr::EMIE_LMOUSE_PRESSED_DOWN;
					MouseButtonStates |= irr::EMBSM_LEFT;
				} else {
					irrevent.MouseInput.Event = irr::EMIE_LMOUSE_LEFT_UP;
					MouseButtonStates &= ~irr::EMBSM_LEFT;
				}
				break;

			case SDL_BUTTON_RIGHT:
				if (SDL_event.type == SDL_MOUSEBUTTONDOWN) {
					irrevent.MouseInput.Event = irr::EMIE_RMOUSE_PRESSED_DOWN;
					MouseButtonStates |= irr::EMBSM_RIGHT;
				} else {
					irrevent.MouseInput.Event = irr::EMIE_RMOUSE_LEFT_UP;
					MouseButtonStates &= ~irr::EMBSM_RIGHT;
				}
				break;

			case SDL_BUTTON_MIDDLE:
				if (SDL_event.type == SDL_MOUSEBUTTONDOWN) {
					irrevent.MouseInput.Event = irr::EMIE_MMOUSE_PRESSED_DOWN;
					MouseButtonStates |= irr::EMBSM_MIDDLE;
				} else {
					irrevent.MouseInput.Event = irr::EMIE_MMOUSE_LEFT_UP;
					MouseButtonStates &= ~irr::EMBSM_MIDDLE;
				}
				break;
			}

			irrevent.MouseInput.ButtonStates = MouseButtonStates;

			if (irrevent.MouseInput.Event != irr::EMIE_MOUSE_MOVED) {
				postEventFromUser(irrevent);

				if (irrevent.MouseInput.Event >= EMIE_LMOUSE_PRESSED_DOWN && irrevent.MouseInput.Event <= EMIE_MMOUSE_PRESSED_DOWN) {
					u32 clicks = checkSuccessiveClicks(irrevent.MouseInput.X, irrevent.MouseInput.Y, irrevent.MouseInput.Event);
					if (clicks == 2) {
						irrevent.MouseInput.Event = (EMOUSE_INPUT_EVENT)(EMIE_LMOUSE_DOUBLE_CLICK + irrevent.MouseInput.Event - EMIE_LMOUSE_PRESSED_DOWN);
						postEventFromUser(irrevent);
					} else if (clicks == 3) {
						irrevent.MouseInput.Event = (EMOUSE_INPUT_EVENT)(EMIE_LMOUSE_TRIPLE_CLICK + irrevent.MouseInput.Event - EMIE_LMOUSE_PRESSED_DOWN);
						postEventFromUser(irrevent);
					}
				}
			}
			break;
		}

		case SDL_TEXTINPUT: {
			irrevent.EventType = irr::EET_STRING_INPUT_EVENT;
			irrevent.StringInput.Str = new core::stringw();
			irr::core::utf8ToWString(*irrevent.StringInput.Str, SDL_event.text.text);
			postEventFromUser(irrevent);
			delete irrevent.StringInput.Str;
			irrevent.StringInput.Str = NULL;
		} break;

		case SDL_KEYDOWN:
		case SDL_KEYUP: {
			SKeyMap mp;
			mp.SDLKey = SDL_event.key.keysym.sym;
			s32 idx = KeyMap.binary_search(mp);

			EKEY_CODE key;
			if (idx == -1)
				key = (EKEY_CODE)0;
			else
				key = (EKEY_CODE)KeyMap[idx].Win32Key;

			if (key == (EKEY_CODE)0)
				os::Printer::log("keycode not mapped", core::stringc(mp.SDLKey), ELL_DEBUG);

			// Make sure to only input special characters if something is in focus, as SDL_TEXTINPUT handles normal unicode already
			if (SDL_IsTextInputActive() && !keyIsKnownSpecial(key) && (SDL_event.key.keysym.mod & KMOD_CTRL) == 0)
				break;

			irrevent.EventType = irr::EET_KEY_INPUT_EVENT;
			irrevent.KeyInput.Key = key;
			irrevent.KeyInput.PressedDown = (SDL_event.type == SDL_KEYDOWN);
			irrevent.KeyInput.Shift = (SDL_event.key.keysym.mod & KMOD_SHIFT) != 0;
			irrevent.KeyInput.Control = (SDL_event.key.keysym.mod & KMOD_CTRL) != 0;
			irrevent.KeyInput.Char = findCharToPassToIrrlicht(mp.SDLKey, key);
			postEventFromUser(irrevent);
		} break;

		case SDL_QUIT:
			Close = true;
			break;

		case SDL_WINDOWEVENT:
			switch (SDL_event.window.event) {
			case SDL_WINDOWEVENT_RESIZED:
				if ((SDL_event.window.data1 != (int)Width) || (SDL_event.window.data2 != (int)Height)) {
					Width = SDL_event.window.data1;
					Height = SDL_event.window.data2;
					if (VideoDriver)
						VideoDriver->OnResize(core::dimension2d<u32>(Width, Height));
				}
				break;
			}

		case SDL_USEREVENT:
			irrevent.EventType = irr::EET_USER_EVENT;
			irrevent.UserEvent.UserData1 = reinterpret_cast<uintptr_t>(SDL_event.user.data1);
			irrevent.UserEvent.UserData2 = reinterpret_cast<uintptr_t>(SDL_event.user.data2);

			postEventFromUser(irrevent);
			break;

		case SDL_FINGERDOWN:
			irrevent.EventType = EET_TOUCH_INPUT_EVENT;
			irrevent.TouchInput.Event = ETIE_PRESSED_DOWN;
			irrevent.TouchInput.ID = SDL_event.tfinger.fingerId;
			irrevent.TouchInput.X = SDL_event.tfinger.x * Width;
			irrevent.TouchInput.Y = SDL_event.tfinger.y * Height;
			CurrentTouchCount++;
			irrevent.TouchInput.touchedCount = CurrentTouchCount;

			postEventFromUser(irrevent);
			break;

		case SDL_FINGERMOTION:
			irrevent.EventType = EET_TOUCH_INPUT_EVENT;
			irrevent.TouchInput.Event = ETIE_MOVED;
			irrevent.TouchInput.ID = SDL_event.tfinger.fingerId;
			irrevent.TouchInput.X = SDL_event.tfinger.x * Width;
			irrevent.TouchInput.Y = SDL_event.tfinger.y * Height;
			irrevent.TouchInput.touchedCount = CurrentTouchCount;

			postEventFromUser(irrevent);
			break;

		case SDL_FINGERUP:
			irrevent.EventType = EET_TOUCH_INPUT_EVENT;
			irrevent.TouchInput.Event = ETIE_LEFT_UP;
			irrevent.TouchInput.ID = SDL_event.tfinger.fingerId;
			irrevent.TouchInput.X = SDL_event.tfinger.x * Width;
			irrevent.TouchInput.Y = SDL_event.tfinger.y * Height;
			// To match Android behavior, still count the pointer that was
			// just released.
			irrevent.TouchInput.touchedCount = CurrentTouchCount;
			if (CurrentTouchCount > 0) {
				CurrentTouchCount--;
			}

			postEventFromUser(irrevent);
			break;

		default:
			break;
		} // end switch
		resetReceiveTextInputEvents();
	} // end while

#if defined(_IRR_COMPILE_WITH_JOYSTICK_EVENTS_)
	// TODO: Check if the multiple open/close calls are too expensive, then
	// open/close in the constructor/destructor instead

	// update joystick states manually
	SDL_JoystickUpdate();
	// we'll always send joystick input events...
	SEvent joyevent;
	joyevent.EventType = EET_JOYSTICK_INPUT_EVENT;
	for (u32 i = 0; i < Joysticks.size(); ++i) {
		SDL_Joystick *joystick = Joysticks[i];
		if (joystick) {
			int j;
			// query all buttons
			const int numButtons = core::min_(SDL_JoystickNumButtons(joystick), 32);
			joyevent.JoystickEvent.ButtonStates = 0;
			for (j = 0; j < numButtons; ++j)
				joyevent.JoystickEvent.ButtonStates |= (SDL_JoystickGetButton(joystick, j) << j);

			// query all axes, already in correct range
			const int numAxes = core::min_(SDL_JoystickNumAxes(joystick), (int)SEvent::SJoystickEvent::NUMBER_OF_AXES);
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_X] = 0;
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_Y] = 0;
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_Z] = 0;
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_R] = 0;
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_U] = 0;
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_V] = 0;
			for (j = 0; j < numAxes; ++j)
				joyevent.JoystickEvent.Axis[j] = SDL_JoystickGetAxis(joystick, j);

			// we can only query one hat, SDL only supports 8 directions
			if (SDL_JoystickNumHats(joystick) > 0) {
				switch (SDL_JoystickGetHat(joystick, 0)) {
				case SDL_HAT_UP:
					joyevent.JoystickEvent.POV = 0;
					break;
				case SDL_HAT_RIGHTUP:
					joyevent.JoystickEvent.POV = 4500;
					break;
				case SDL_HAT_RIGHT:
					joyevent.JoystickEvent.POV = 9000;
					break;
				case SDL_HAT_RIGHTDOWN:
					joyevent.JoystickEvent.POV = 13500;
					break;
				case SDL_HAT_DOWN:
					joyevent.JoystickEvent.POV = 18000;
					break;
				case SDL_HAT_LEFTDOWN:
					joyevent.JoystickEvent.POV = 22500;
					break;
				case SDL_HAT_LEFT:
					joyevent.JoystickEvent.POV = 27000;
					break;
				case SDL_HAT_LEFTUP:
					joyevent.JoystickEvent.POV = 31500;
					break;
				case SDL_HAT_CENTERED:
				default:
					joyevent.JoystickEvent.POV = 65535;
					break;
				}
			} else {
				joyevent.JoystickEvent.POV = 65535;
			}

			// we map the number directly
			joyevent.JoystickEvent.Joystick = static_cast<u8>(i);
			// now post the event
			postEventFromUser(joyevent);
			// and close the joystick
		}
	}
#endif
	return !Close;
}